

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# u16_test.c
# Opt level: O2

bool_t u16Test(void)

{
  u16 uVar1;
  u16 uVar2;
  bool_t bVar3;
  undefined8 in_RAX;
  size_t sVar4;
  uint uVar5;
  u16 a [2];
  octet b [4];
  uint uVar6;
  
  _a = CONCAT44(SUB84((ulong)in_RAX >> 0x20,0),0x2010102);
  uVar1 = u16Rev(0x102);
  uVar5 = 0;
  uVar6 = 0;
  if (uVar1 == 0x201) {
    uVar1 = u16Rev(0x201);
    if (uVar1 == 0x102) {
      u16Rev2(a,2);
      u16Rev2(a,2);
      if (a[0] == 0x102) {
        uVar1 = a[1];
        uVar2 = u16Rev(0x102);
        uVar5 = uVar6;
        if (uVar1 == uVar2) {
          uVar1 = u16Bitrev(0x102);
          if (uVar1 == 0x4080) {
            uVar1 = u16Bitrev(0x102);
            uVar1 = u16Bitrev(uVar1);
            if (uVar1 == 0x102) {
              uVar5 = 0;
              sVar4 = u16Weight(0);
              if (sVar4 == 0) {
                uVar5 = 0;
                bVar3 = u16Parity(0);
                if (bVar3 == 0) {
                  bVar3 = u16Parity(1);
                  if (bVar3 != 0) {
                    sVar4 = u16Weight(0xa001);
                    if (sVar4 == 3) {
                      bVar3 = u16Parity(0xa001);
                      if (bVar3 != 0) {
                        sVar4 = u16Weight(0xffff);
                        if (sVar4 == 0x10) {
                          bVar3 = u16Parity(0xffff);
                          if (bVar3 == 0) {
                            sVar4 = u16Weight(0xfff8);
                            if (sVar4 == 0xd) {
                              uVar5 = 0;
                              sVar4 = u16CTZ(0);
                              if (sVar4 == 0x10) {
                                uVar5 = 0;
                                sVar4 = u16CTZ_fast(0);
                                if (sVar4 == 0x10) {
                                  uVar5 = 0;
                                  sVar4 = u16CLZ(0);
                                  if (sVar4 == 0x10) {
                                    uVar5 = 0;
                                    sVar4 = u16CLZ_fast(0);
                                    if (sVar4 == 0x10) {
                                      sVar4 = u16CTZ(1);
                                      if (sVar4 == 0) {
                                        sVar4 = u16CTZ_fast(1);
                                        if (sVar4 == 0) {
                                          sVar4 = u16CLZ(1);
                                          if (sVar4 == 0xf) {
                                            sVar4 = u16CLZ_fast(1);
                                            if (sVar4 == 0xf) {
                                              sVar4 = u16CTZ(0xfff8);
                                              if (sVar4 == 3) {
                                                sVar4 = u16CTZ_fast(0xfff8);
                                                if (sVar4 == 3) {
                                                  sVar4 = u16CLZ(0xfff8);
                                                  if (sVar4 == 0) {
                                                    sVar4 = u16CLZ_fast(0xfff8);
                                                    if (sVar4 == 0) {
                                                      uVar5 = 0;
                                                      uVar1 = u16Deshuffle(0);
                                                      if (uVar1 == 0) {
                                                        uVar1 = u16Deshuffle(1);
                                                        if (uVar1 == 1) {
                                                          uVar1 = u16Deshuffle(2);
                                                          if (uVar1 == 0x100) {
                                                            uVar1 = u16Deshuffle(0xaaaa);
                                                            if (uVar1 == 0xff00) {
                                                              uVar1 = u16Deshuffle(0x3210);
                                                              uVar1 = u16Shuffle(uVar1);
                                                              if (uVar1 == 0x3210) {
                                                                uVar1 = u16Shuffle(0xdcba);
                                                                uVar1 = u16Deshuffle(uVar1);
                                                                if (uVar1 == 0xdcba) {
                                                                  uVar1 = u16NegInv(1);
                                                                  if (uVar1 == 0xffff) {
                                                                    uVar1 = u16NegInv(5);
                                                                    if (uVar1 == 0x3333) {
                                                                      uVar1 = u16NegInv(0x3333);
                                                                      if (uVar1 == 5) {
                                                                        u16To(b,3,a);
                                                                        u16From(a,b,3);
                                                                        uVar5 = (uint)(a[1] == 1 &&
                                                                                      (short)_a ==
                                                                                      0x102);
                                                                      }
                                                                    }
                                                                  }
                                                                }
                                                              }
                                                            }
                                                          }
                                                        }
                                                      }
                                                    }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return uVar5;
}

Assistant:

bool_t u16Test()
{
	u16 w = 0x0102;
	u16 a[2] = {0x0102, 0x0201};
	octet b[4];
	// rot
	if (u16RotHi(w, 1) != 0x0204 ||
		u16RotHi(w, 4) != 0x1020 ||
		u16RotHi(w, 8) != 0x0201 ||
		u16RotLo(u16RotHi(w, 7), 7) != w ||
		u16RotLo(u16RotHi(w, 9), 9) != w ||
		u16RotLo(u16RotHi(w, 13), 13) != w)
		return FALSE;
	// reverse
	if (u16Rev(w) != a[1] || u16Rev(a[1]) != w)
		return FALSE;
	u16Rev2(a, 2), u16Rev2(a, 2);
	if (a[0] != w || a[1] != u16Rev(w))
		return FALSE;
	// bit reverse
	if (u16Bitrev(w) != 0x4080|| u16Bitrev(u16Bitrev(w)) != w)
		return FALSE;
	// weight / parity
	if (u16Weight(0) != 0 || u16Parity(0) || !u16Parity(1) ||
		u16Weight(0xA001) != 3 || !u16Parity(0xA001) ||
		u16Weight(0xFFFF) != 16 || u16Parity(0xFFFF) ||
		u16Weight(0xFFF8) != 13)
		return FALSE;
	// CTZ / CLZ
	if (SAFE(u16CTZ)(0) != 16 || FAST(u16CTZ)(0) != 16 ||
		SAFE(u16CLZ)(0) != 16 || FAST(u16CLZ)(0) != 16 ||
		SAFE(u16CTZ)(1) != 0 || FAST(u16CTZ)(1) != 0 ||
		SAFE(u16CLZ)(1) != 15 || FAST(u16CLZ)(1) != 15 ||
		SAFE(u16CTZ)(0xFFF8) != 3 || FAST(u16CTZ)(0xFFF8) != 3 ||
		SAFE(u16CLZ)(0xFFF8) != 0 || FAST(u16CLZ)(0xFFF8) != 0
		)
		return FALSE;
	// shuffle
	if (u16Deshuffle(0) != 0 || u16Deshuffle(1) != 1 ||
		u16Deshuffle(2) != 0x0100 ||
		u16Deshuffle(0xAAAA) != 0xFF00 || 
		u16Shuffle(u16Deshuffle(0x3210)) != 0x3210 ||
		u16Deshuffle(u16Shuffle(0xDCBA)) != 0xDCBA)
		return FALSE;
	// negInv
	if (u16NegInv(1) != U16_MAX ||
		u16NegInv(5) != 13107 || u16NegInv(13107) != 5)
		return FALSE;
	// from / to
	u16To(b, 3, a), u16From(a, b, 3);
	if (a[0] != w || a[1] != 0x0001)
		return FALSE;
	// все нормально
	return TRUE;
}